

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_std_suite.cpp
# Opt level: O0

void compact_vector_suite::test_uint8_one(void)

{
  iterator iVar1;
  iterator iVar2;
  undefined2 local_e6;
  undefined1 local_e4;
  undefined1 local_e3;
  allocator<unsigned_char> local_e2;
  value_type_conflict local_e1;
  undefined1 local_e0 [2];
  output_type expected [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  undefined1 local_b8 [8];
  oarchive ar;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((oarchive *)local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20)
  ;
  local_e1 = 0xff;
  std::allocator<unsigned_char>::allocator(&local_e2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,1,&local_e1,&local_e2
            );
  std::allocator<unsigned_char>::~allocator(&local_e2);
  boost::archive::detail::interface_oarchive<trial::protocol::bintoken::oarchive>::operator<<
            ((interface_oarchive<trial::protocol::bintoken::oarchive> *)local_b8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
  local_e4 = 0xff;
  local_e6 = 0x1a8;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_std_suite.cpp"
             ,0x1d5,"void compact_vector_suite::test_uint8_one()",iVar1._M_current,iVar2._M_current,
             &local_e6,&local_e3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
  trial::protocol::bintoken::oarchive::~oarchive((oarchive *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_uint8_one()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    std::vector<std::uint8_t> value(1, 0xFF);
    ar << value;

    output_type expected[] = { token::code::array8_int8, 0x01, 0xFF };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<output_type>());
}